

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int lyxp_node_atomize(lys_node *node,lyxp_set *set,int set_ext_dep_flags)

{
  uint16_t uVar1;
  uint16_t uVar2;
  LYS_NODE LVar3;
  char *pcVar4;
  int iVar5;
  lys_node *plVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  bool bVar9;
  char *local_a8;
  char *path;
  lys_restr *must;
  lys_when *when;
  uint local_88;
  int ret;
  int opts;
  uint32_t j;
  uint32_t i;
  uint8_t must_size;
  lyxp_set tmp_set;
  lys_node *ctx_snode;
  lys_node *elem;
  lys_node *parent;
  int set_ext_dep_flags_local;
  lyxp_set *set_local;
  lys_node *node_local;
  
  tmp_set._56_8_ = 0;
  j._3_1_ = 0;
  when._4_4_ = 0;
  must = (lys_restr *)0x0;
  path = (char *)0x0;
  local_a8 = (char *)0x0;
  memset(&i,0,0x40);
  memset(set,0,0x40);
  local_88 = 0;
  elem = node;
  while( true ) {
    bVar9 = false;
    if (elem != (lys_node *)0x0) {
      bVar9 = elem->nodetype != LYS_OUTPUT;
    }
    if (!bVar9) break;
    elem = lys_parent(elem);
  }
  if (elem != (lys_node *)0x0) {
    local_88 = 0x20;
  }
  LVar3 = node->nodetype;
  if (LVar3 == LYS_CONTAINER) {
    must = (lys_restr *)node[1].name;
    path = node[1].dsc;
    j._3_1_ = node->padding[1];
  }
  else if (LVar3 == LYS_CHOICE) {
    must = *(lys_restr **)node->hash;
  }
  else if (LVar3 == LYS_LEAF) {
    must = (lys_restr *)node[1].name;
    path = node[1].dsc;
    j._3_1_ = node->padding[3];
  }
  else if (LVar3 == LYS_LEAFLIST) {
    must = (lys_restr *)node[1].name;
    path = node[1].dsc;
    j._3_1_ = node->padding[3];
  }
  else if (LVar3 == LYS_LIST) {
    must = (lys_restr *)node[1].name;
    path = node[1].dsc;
    j._3_1_ = node->padding[0];
  }
  else if (LVar3 == LYS_ANYXML) {
LAB_001b1cb7:
    must = (lys_restr *)node[1].name;
    path = node[1].dsc;
    j._3_1_ = node->padding[3];
  }
  else if (LVar3 == LYS_CASE) {
    must = *(lys_restr **)node->hash;
  }
  else if (LVar3 == LYS_NOTIF) {
    path = node[1].dsc;
    j._3_1_ = node->padding[1];
  }
  else if ((LVar3 == LYS_INPUT) || (LVar3 == LYS_OUTPUT)) {
    path = node[1].name;
    j._3_1_ = node->padding[1];
  }
  else if (LVar3 == LYS_USES) {
    must = *(lys_restr **)node->hash;
  }
  else if (LVar3 == LYS_AUGMENT) {
    must = (lys_restr *)node->next;
  }
  else if (LVar3 == LYS_ANYDATA) goto LAB_001b1cb7;
  plVar6 = node;
  if (set_ext_dep_flags != 0) {
    while( true ) {
      elem = plVar6;
      bVar9 = false;
      if (elem != (lys_node *)0x0) {
        bVar9 = (elem->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN;
      }
      if (!bVar9) break;
      plVar6 = lys_parent(elem);
    }
  }
  if (must != (lys_restr *)0x0) {
    iVar5 = lyxp_atomize(must->expr,node,LYXP_NODE_ELEM,(lyxp_set *)&i,local_88 | 0x10,
                         (lys_node **)&tmp_set.field_0x38);
    if (iVar5 != 0) {
      free((void *)tmp_set._8_8_);
      if (tmp_set._56_8_ == 0) {
        ly_vlog(node->module->ctx,LYE_SPEC,LY_VLOG_LYS,node,"Invalid when condition \"%s\".",
                must->expr);
      }
      else {
        local_a8 = lys_path((lys_node *)tmp_set._56_8_,1);
        ly_vlog(node->module->ctx,LYE_SPEC,LY_VLOG_LYS,node,
                "Invalid when condition \"%s\" with context node \"%s\".",must->expr,local_a8);
      }
      when._4_4_ = -1;
      goto LAB_001b24a0;
    }
    if (set_ext_dep_flags != 0) {
      for (ret = 0; (uint)ret < (uint)tmp_set.val._8_4_; ret = ret + 1) {
        if (*(int *)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10 + 8) == 2) {
          uVar1 = node->flags;
          plVar7 = lys_node_module(node);
          pcVar4 = node->name;
          uVar2 = *(uint16_t *)(*(long *)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10) + 0x18);
          plVar8 = lys_node_module(*(lys_node **)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10));
          iVar5 = lyp_check_status(uVar1,plVar7,pcVar4,uVar2,plVar8,
                                   (char *)**(undefined8 **)
                                             (tmp_set._8_8_ + (ulong)(uint)ret * 0x10),node);
          if (iVar5 != 0) {
            when._4_4_ = -1;
            goto LAB_001b24a0;
          }
          if (elem != (lys_node *)0x0) {
            for (ctx_snode = *(lys_node **)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10);
                ctx_snode != (lys_node *)0x0 && ctx_snode != elem; ctx_snode = lys_parent(ctx_snode)
                ) {
            }
            if (ctx_snode == (lys_node *)0x0) {
              if ((*(ushort *)(*(long *)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10) + 0x18) & 1) == 0)
              {
                if ((*(ushort *)(*(long *)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10) + 0x18) & 2) ==
                    0) {
                  __assert_fail("tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_R",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                                ,0x22cc,
                                "int lyxp_node_atomize(const struct lys_node *, struct lyxp_set *, int)"
                               );
                }
                *(ushort *)((long)&must->emsg + 2) = *(ushort *)((long)&must->emsg + 2) | 0x400;
                node->flags = node->flags | 0x400;
              }
              else {
                *(ushort *)((long)&must->emsg + 2) = *(ushort *)((long)&must->emsg + 2) | 0x200;
                node->flags = node->flags | 0x200;
              }
            }
          }
        }
      }
    }
    set_snode_merge(set,(lyxp_set *)&i);
    memset(&i,0,0x40);
  }
  for (opts = 0; (uint)opts < (uint)j._3_1_; opts = opts + 1) {
    iVar5 = lyxp_atomize(*(char **)(path + (ulong)(uint)opts * 0x38),node,LYXP_NODE_ELEM,
                         (lyxp_set *)&i,local_88 | 8,(lys_node **)&tmp_set.field_0x38);
    if (iVar5 != 0) {
      free((void *)tmp_set._8_8_);
      if (tmp_set._56_8_ == 0) {
        ly_vlog(node->module->ctx,LYE_SPEC,LY_VLOG_LYS,node,"Invalid must restriction \"%s\".",
                *(undefined8 *)(path + (ulong)(uint)opts * 0x38));
      }
      else {
        local_a8 = lys_path((lys_node *)tmp_set._56_8_,1);
        ly_vlog(node->module->ctx,LYE_SPEC,LY_VLOG_LYS,node,
                "Invalid must restriction \"%s\" with context node \"%s\".",
                *(undefined8 *)(path + (ulong)(uint)opts * 0x38),local_a8);
      }
      when._4_4_ = -1;
      break;
    }
    if (set_ext_dep_flags != 0) {
      for (ret = 0; (uint)ret < (uint)tmp_set.val._8_4_; ret = ret + 1) {
        if (*(int *)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10 + 8) == 2) {
          uVar1 = node->flags;
          plVar7 = lys_node_module(node);
          pcVar4 = node->name;
          uVar2 = *(uint16_t *)(*(long *)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10) + 0x18);
          plVar8 = lys_node_module(*(lys_node **)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10));
          iVar5 = lyp_check_status(uVar1,plVar7,pcVar4,uVar2,plVar8,
                                   (char *)**(undefined8 **)
                                             (tmp_set._8_8_ + (ulong)(uint)ret * 0x10),node);
          if (iVar5 != 0) {
            when._4_4_ = -1;
            goto LAB_001b24a0;
          }
          if (elem != (lys_node *)0x0) {
            for (ctx_snode = *(lys_node **)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10);
                ctx_snode != (lys_node *)0x0 && ctx_snode != elem; ctx_snode = lys_parent(ctx_snode)
                ) {
            }
            if (ctx_snode == (lys_node *)0x0) {
              if ((*(ushort *)(*(long *)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10) + 0x18) & 1) == 0)
              {
                if ((*(ushort *)(*(long *)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10) + 0x18) & 2) ==
                    0) {
                  ctx_snode = *(lys_node **)(tmp_set._8_8_ + (ulong)(uint)ret * 0x10);
                  while( true ) {
                    bVar9 = false;
                    if (ctx_snode != (lys_node *)0x0) {
                      bVar9 = ctx_snode->nodetype != LYS_AUGMENT;
                    }
                    if (!bVar9) break;
                    ctx_snode = ctx_snode->parent;
                  }
                  if ((ctx_snode == (lys_node *)0x0) ||
                     (plVar7 = lys_node_module(ctx_snode),
                     (*(ushort *)&plVar7->field_0x40 >> 7 & 1) != 0)) {
                    __assert_fail("elem && !lys_node_module(elem)->implemented",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                                  ,0x2303,
                                  "int lyxp_node_atomize(const struct lys_node *, struct lyxp_set *, int)"
                                 );
                  }
                }
                else {
                  *(ushort *)(path + (ulong)(uint)opts * 0x38 + 0x32) =
                       *(ushort *)(path + (ulong)(uint)opts * 0x38 + 0x32) | 0x400;
                  node->flags = node->flags | 0x400;
                }
              }
              else {
                *(ushort *)(path + (ulong)(uint)opts * 0x38 + 0x32) =
                     *(ushort *)(path + (ulong)(uint)opts * 0x38 + 0x32) | 0x200;
                node->flags = node->flags | 0x200;
              }
            }
          }
        }
      }
    }
    set_snode_merge(set,(lyxp_set *)&i);
    memset(&i,0,0x40);
  }
LAB_001b24a0:
  if (when._4_4_ != 0) {
    free((set->val).nodes);
    memset(set,0,0x40);
  }
  free(local_a8);
  return when._4_4_;
}

Assistant:

int
lyxp_node_atomize(const struct lys_node *node, struct lyxp_set *set, int set_ext_dep_flags)
{
    struct lys_node *parent, *elem;
    const struct lys_node *ctx_snode = NULL;
    struct lyxp_set tmp_set;
    uint8_t must_size = 0;
    uint32_t i, j;
    int opts, ret = EXIT_SUCCESS;
    struct lys_when *when = NULL;
    struct lys_restr *must = NULL;
    char *path = NULL;

    memset(&tmp_set, 0, sizeof tmp_set);
    memset(set, 0, sizeof *set);

    /* check if we will be traversing RPC output */
    opts = 0;
    for (parent = (struct lys_node *)node; parent && (parent->nodetype != LYS_OUTPUT); parent = lys_parent(parent));
    if (parent) {
        opts |= LYXP_SNODE_OUTPUT;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        when = ((struct lys_node_container *)node)->when;
        must = ((struct lys_node_container *)node)->must;
        must_size = ((struct lys_node_container *)node)->must_size;
        break;
    case LYS_CHOICE:
        when = ((struct lys_node_choice *)node)->when;
        break;
    case LYS_LEAF:
        when = ((struct lys_node_leaf *)node)->when;
        must = ((struct lys_node_leaf *)node)->must;
        must_size = ((struct lys_node_leaf *)node)->must_size;
        break;
    case LYS_LEAFLIST:
        when = ((struct lys_node_leaflist *)node)->when;
        must = ((struct lys_node_leaflist *)node)->must;
        must_size = ((struct lys_node_leaflist *)node)->must_size;
        break;
    case LYS_LIST:
        when = ((struct lys_node_list *)node)->when;
        must = ((struct lys_node_list *)node)->must;
        must_size = ((struct lys_node_list *)node)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        when = ((struct lys_node_anydata *)node)->when;
        must = ((struct lys_node_anydata *)node)->must;
        must_size = ((struct lys_node_anydata *)node)->must_size;
        break;
    case LYS_CASE:
        when = ((struct lys_node_case *)node)->when;
        break;
    case LYS_NOTIF:
        must = ((struct lys_node_notif *)node)->must;
        must_size = ((struct lys_node_notif *)node)->must_size;
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        must = ((struct lys_node_inout *)node)->must;
        must_size = ((struct lys_node_inout *)node)->must_size;
        break;
    case LYS_USES:
        when = ((struct lys_node_uses *)node)->when;
        break;
    case LYS_AUGMENT:
        when = ((struct lys_node_augment *)node)->when;
        break;
    default:
        /* nothing to check */
        break;
    }

    if (set_ext_dep_flags) {
        /* find operation if in one, used later */
        for (parent = (struct lys_node *)node;
             parent && !(parent->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF));
             parent = lys_parent(parent));
    }

    /* check "when" */
    if (when) {
        if (lyxp_atomize(when->cond, node, LYXP_NODE_ELEM, &tmp_set, LYXP_SNODE_WHEN | opts, &ctx_snode)) {
            free(tmp_set.val.snodes);
            if (ctx_snode) {
                path = lys_path(ctx_snode, LYS_PATH_FIRST_PREFIX);
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node,
                       "Invalid when condition \"%s\" with context node \"%s\".", when->cond, path);
            } else {
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node, "Invalid when condition \"%s\".", when->cond);
            }
            ret = -1;
            goto finish;
        } else {
            if (set_ext_dep_flags) {
                for (j = 0; j < tmp_set.used; ++j) {
                    /* skip roots'n'stuff */
                    if (tmp_set.val.snodes[j].type == LYXP_NODE_ELEM) {
                        /* XPath expression cannot reference "lower" status than the node that has the definition */
                        if (lyp_check_status(node->flags, lys_node_module(node), node->name, tmp_set.val.snodes[j].snode->flags,
                                lys_node_module(tmp_set.val.snodes[j].snode), tmp_set.val.snodes[j].snode->name, node)) {
                            ret = -1;
                            goto finish;
                        }

                        if (parent) {
                            for (elem = tmp_set.val.snodes[j].snode; elem && (elem != parent); elem = lys_parent(elem));
                            if (!elem) {
                                /* not in node's RPC or notification subtree, set the correct dep flag */
                                if (tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_W) {
                                    when->flags |= LYS_XPCONF_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPCONF_DEP;
                                } else {
                                    assert(tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_R);
                                    when->flags |= LYS_XPSTATE_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPSTATE_DEP;
                                }
                            }
                        }
                    }
                }
            }
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

    /* check "must" */
    for (i = 0; i < must_size; ++i) {
        if (lyxp_atomize(must[i].expr, node, LYXP_NODE_ELEM, &tmp_set, LYXP_SNODE_MUST | opts, &ctx_snode)) {
            free(tmp_set.val.snodes);
            if (ctx_snode) {
                path = lys_path(ctx_snode, LYS_PATH_FIRST_PREFIX);
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node,
                       "Invalid must restriction \"%s\" with context node \"%s\".", must[i].expr, path);
            } else {
                LOGVAL(node->module->ctx, LYE_SPEC, LY_VLOG_LYS, node, "Invalid must restriction \"%s\".", must[i].expr);
            }
            ret = -1;
            goto finish;
        } else {
            if (set_ext_dep_flags) {
                for (j = 0; j < tmp_set.used; ++j) {
                    /* skip roots'n'stuff */
                    if (tmp_set.val.snodes[j].type == LYXP_NODE_ELEM) {
                        /* XPath expression cannot reference "lower" status than the node that has the definition */
                        if (lyp_check_status(node->flags, lys_node_module(node), node->name, tmp_set.val.snodes[j].snode->flags,
                                lys_node_module(tmp_set.val.snodes[j].snode), tmp_set.val.snodes[j].snode->name, node)) {
                            ret = -1;
                            goto finish;
                        }

                        if (parent) {
                            for (elem = tmp_set.val.snodes[j].snode; elem && (elem != parent); elem = lys_parent(elem));
                            if (!elem) {
                                /* not in node's RPC or notification subtree, set the correct dep flag */
                                if (tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_W) {
                                    must[i].flags |= LYS_XPCONF_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPCONF_DEP;
                                } else if (tmp_set.val.snodes[j].snode->flags & LYS_CONFIG_R) {
                                    must[i].flags |= LYS_XPSTATE_DEP;
                                    ((struct lys_node *)node)->flags |= LYS_XPSTATE_DEP;
                                } else {
                                    /* only possible if the node is in an unimplemented augment */
                                    elem = tmp_set.val.snodes[j].snode;
                                    while (elem && (elem->nodetype != LYS_AUGMENT)) {
                                        elem = elem->parent;
                                    }
                                    assert(elem && !lys_node_module(elem)->implemented);
                                }
                            }
                        }
                    }
                }
            }
            set_snode_merge(set, &tmp_set);
            memset(&tmp_set, 0, sizeof tmp_set);
        }
    }

finish:
    if (ret) {
        free(set->val.snodes);
        memset(set, 0, sizeof *set);
    }
    free(path);
    return ret;
}